

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.h
# Opt level: O0

Unicode * __thiscall FastRegExp::Unicode::toString<char32_t>(Unicode *this,char32_t *v)

{
  wstring_convert<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  local_78;
  char32_t *local_18;
  char32_t *v_local;
  
  local_18 = v;
  v_local = (char32_t *)this;
  std::__cxx11::
  wstring_convert<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::wstring_convert(&local_78);
  std::__cxx11::
  wstring_convert<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::to_bytes((wstring_convert<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
              *)this,(char32_t)&local_78);
  std::__cxx11::
  wstring_convert<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::~wstring_convert(&local_78);
  return this;
}

Assistant:

static inline std::string toString(const T &v)
{
    return std::wstring_convert<
        DeletableFacet<
            std::codecvt<
                char32_t,
                char,
                std::mbstate_t
            >
        >,
        char32_t
    >().to_bytes(v);
}